

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EnumSerializers.hpp
# Opt level: O0

XMLNodeAdapter *
BSDFData::operator>>(XMLNodeAdapter *node,WavelengthDataDirection *wavelengthDataDirection)

{
  XMLNodeAdapter *pXVar1;
  function<BSDFData::WavelengthDataDirection_(std::basic_string_view<char,_std::char_traits<char>_>)>
  local_38;
  WavelengthDataDirection *local_18;
  WavelengthDataDirection *wavelengthDataDirection_local;
  XMLNodeAdapter *node_local;
  
  local_18 = wavelengthDataDirection;
  wavelengthDataDirection_local = (WavelengthDataDirection *)node;
  std::
  function<BSDFData::WavelengthDataDirection(std::basic_string_view<char,std::char_traits<char>>)>::
  function<BSDFData::WavelengthDataDirection(&)(std::basic_string_view<char,std::char_traits<char>>),void>
            ((function<BSDFData::WavelengthDataDirection(std::basic_string_view<char,std::char_traits<char>>)>
              *)&local_38,WavelengthDataDirectionFromString);
  pXVar1 = FileParse::deserializeEnum<XMLNodeAdapter,BSDFData::WavelengthDataDirection>
                     (node,wavelengthDataDirection,&local_38);
  std::
  function<BSDFData::WavelengthDataDirection_(std::basic_string_view<char,_std::char_traits<char>_>)>
  ::~function(&local_38);
  return pXVar1;
}

Assistant:

const NodeAdapter & operator>>(const NodeAdapter & node,
                                   BSDFData::WavelengthDataDirection & wavelengthDataDirection)
    {
        return FileParse::deserializeEnum<NodeAdapter, WavelengthDataDirection>(
          node, wavelengthDataDirection, WavelengthDataDirectionFromString);
    }